

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  long in_RSI;
  long lVar1;
  long in_FS_OFFSET;
  Iterator *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < *(int *)(in_RSI + 0x38)) {
    lVar1 = 0;
    do {
      IteratorWrapper::status((IteratorWrapper *)&local_38);
      if (local_38 != (Iterator *)0x0) goto LAB_00d2558c;
      lVar1 = lVar1 + 1;
    } while (lVar1 < *(int *)(in_RSI + 0x38));
  }
  local_38 = (Iterator *)0x0;
LAB_00d2558c:
  (this->super_Iterator)._vptr_Iterator = (_func_int **)local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }